

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetInt32Value(MapValueRef *this,int32 value)

{
  CppType CVar1;
  LogMessage *this_00;
  undefined4 in_ESI;
  MapValueRef *in_RDI;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  CVar1 = type(in_RDI);
  if (CVar1 != CPPTYPE_INT32) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),level,
               (char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    FieldDescriptor::CppTypeName(CPPTYPE_INT32);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    CVar1 = type(in_RDI);
    FieldDescriptor::CppTypeName(CVar1);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff40,
                         (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogMessage::~LogMessage((LogMessage *)0x43ca1f);
  }
  *(undefined4 *)in_RDI->data_ = in_ESI;
  return;
}

Assistant:

void SetInt32Value(int32 value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32, "MapValueRef::SetInt32Value");
    *reinterpret_cast<int32*>(data_) = value;
  }